

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Value::Value(Value *this,Type *t)

{
  MainType MVar1;
  uint32_t uVar2;
  pointer puVar3;
  undefined8 uVar4;
  size_t __n;
  allocator_type local_11;
  
  MVar1 = t->mainType;
  __n = 4;
  if (MVar1 < string) {
    switch(MVar1) {
    case void_:
      __n = 0;
      break;
    case boolean:
      __n = 1;
      break;
    case ~(complexArray|primitiveArray|vector|int64|int32|boolean):
    case ~(complexArray|primitiveArray|vector|int64|int32):
    case int32|boolean:
    case ~(complexArray|primitiveArray|vector|int64|boolean):
    case ~(complexArray|primitiveArray|vector|int64):
switchD_001cc1e4_caseD_2:
      throwError("Invalid type");
    case int32:
      break;
    default:
      if (MVar1 == float32) break;
      if (MVar1 != float64) goto switchD_001cc1e4_caseD_2;
    case int64:
      __n = 8;
    }
  }
  else if (MVar1 < primitiveArray) {
    if (MVar1 != string) {
      if (MVar1 != vector) goto switchD_001cc1e4_caseD_2;
      __n = (ulong)(t->content).vector.numElements * (ulong)((t->content).vector.elementType & 0xf);
    }
  }
  else if (MVar1 == primitiveArray) {
    uVar2 = (t->content).primitiveArray.numVectorElements;
    __n = (ulong)(t->content).vector.numElements *
          (ulong)((uVar2 + (uVar2 == 0)) * ((t->content).vector.elementType & 0xf));
  }
  else if (MVar1 == complexArray) {
    __n = Type::ComplexArray::getValueDataSize((t->content).complexArray);
  }
  else {
    if (MVar1 != object) goto switchD_001cc1e4_caseD_2;
    __n = Type::Object::getValueDataSize((t->content).object);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->packedData,__n,&local_11);
  (this->dictionary).super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__SimpleStringDictionary_002d4330;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar3 = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->value).type.mainType = t->mainType;
  uVar4 = *(undefined8 *)((long)&t->content + 8);
  (this->value).type.content.object = (t->content).object;
  *(undefined8 *)((long)&(this->value).type.content + 8) = uVar4;
  (this->value).type.allocator = t->allocator;
  t->mainType = void_;
  (this->value).data = puVar3;
  (this->value).stringDictionary = &(this->dictionary).super_StringDictionary;
  return;
}

Assistant:

inline Value::Value (Type&& t)
   : packedData (static_cast<std::vector<char>::size_type> (t.getValueDataSize())),
     value (std::move (t), packedData.data(), std::addressof (dictionary))
{
}